

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O2

void ft_stroke_border_close(SW_FT_StrokeBorder border,SW_FT_Bool reverse)

{
  uint uVar1;
  SW_FT_Byte SVar2;
  uint uVar3;
  uint uVar4;
  SW_FT_Vector *pSVar5;
  SW_FT_Pos SVar6;
  SW_FT_Pos SVar7;
  SW_FT_Pos SVar8;
  SW_FT_Byte *pSVar9;
  SW_FT_Vector *pSVar10;
  SW_FT_Byte *pSVar11;
  SW_FT_Vector *pSVar12;
  SW_FT_Vector *pSVar13;
  SW_FT_Vector tmp;
  
  uVar3 = border->num_points;
  uVar4 = border->start;
  if (uVar4 + 1 < uVar3) {
    uVar1 = uVar3 - 1;
    border->num_points = uVar1;
    pSVar5 = border->points + uVar1;
    SVar6 = pSVar5->y;
    pSVar13 = border->points + uVar4;
    pSVar13->x = pSVar5->x;
    pSVar13->y = SVar6;
    if (reverse != '\0') {
      pSVar5 = border->points + uVar4;
      pSVar13 = border->points + uVar1;
      while( true ) {
        pSVar12 = pSVar13 + -1;
        pSVar10 = pSVar5 + 1;
        if (pSVar12 <= pSVar10) break;
        SVar6 = pSVar10->x;
        SVar7 = pSVar5[1].y;
        SVar8 = pSVar13[-1].y;
        pSVar10->x = pSVar12->x;
        pSVar5[1].y = SVar8;
        pSVar12->x = SVar6;
        pSVar13[-1].y = SVar7;
        pSVar5 = pSVar10;
        pSVar13 = pSVar12;
      }
      pSVar11 = border->tags + uVar4;
      pSVar9 = border->tags + uVar1;
      while( true ) {
        pSVar9 = pSVar9 + -1;
        pSVar11 = pSVar11 + 1;
        if (pSVar9 <= pSVar11) break;
        SVar2 = *pSVar11;
        *pSVar11 = *pSVar9;
        *pSVar9 = SVar2;
      }
    }
    border->tags[uVar4] = border->tags[uVar4] | 4;
    border->tags[uVar3 - 2] = border->tags[uVar3 - 2] | 8;
  }
  else {
    border->num_points = uVar4;
  }
  border->start = -1;
  border->movable = '\0';
  return;
}

Assistant:

static void ft_stroke_border_close(SW_FT_StrokeBorder border,
                                   SW_FT_Bool         reverse)
{
    SW_FT_UInt start = border->start;
    SW_FT_UInt count = border->num_points;

    assert(border->start >= 0);

    /* don't record empty paths! */
    if (count <= start + 1U)
        border->num_points = start;
    else {
        /* copy the last point to the start of this sub-path, since */
        /* it contains the `adjusted' starting coordinates          */
        border->num_points = --count;
        border->points[start] = border->points[count];

        if (reverse) {
            /* reverse the points */
            {
                SW_FT_Vector* vec1 = border->points + start + 1;
                SW_FT_Vector* vec2 = border->points + count - 1;

                for (; vec1 < vec2; vec1++, vec2--) {
                    SW_FT_Vector tmp;

                    tmp = *vec1;
                    *vec1 = *vec2;
                    *vec2 = tmp;
                }
            }

            /* then the tags */
            {
                SW_FT_Byte* tag1 = border->tags + start + 1;
                SW_FT_Byte* tag2 = border->tags + count - 1;

                for (; tag1 < tag2; tag1++, tag2--) {
                    SW_FT_Byte tmp;

                    tmp = *tag1;
                    *tag1 = *tag2;
                    *tag2 = tmp;
                }
            }
        }

        border->tags[start] |= SW_FT_STROKE_TAG_BEGIN;
        border->tags[count - 1] |= SW_FT_STROKE_TAG_END;
    }

    border->start = -1;
    border->movable = FALSE;
}